

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int compareFiles(char *r1,char *r2)

{
  char cVar1;
  int __fd;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  ssize_t sVar5;
  uint uVar6;
  char bytes1 [4096];
  char bytes2 [4096];
  
  cVar1 = update_results;
  __fd = open64(r1,0);
  if (cVar1 == '\x01') {
    if (__fd < 0) {
      return -1;
    }
    iVar2 = open64(r2,0x241,0x1a4);
    if (-1 < iVar2) {
      do {
        sVar4 = read(__fd,bytes1,0x1000);
        uVar6 = (uint)sVar4;
        if ((int)uVar6 < 1) break;
        sVar4 = write(iVar2,bytes1,(ulong)(uVar6 & 0x7fffffff));
      } while ((uint)sVar4 == uVar6);
      close(iVar2);
      close(__fd);
      return (uint)(uVar6 != 0);
    }
  }
  else {
    if (__fd < 0) {
      return -1;
    }
    iVar2 = open64(r2,0);
    if (-1 < iVar2) {
      do {
        sVar4 = read(__fd,bytes1,0x1000);
        sVar5 = read(iVar2,bytes2,0x1000);
        uVar6 = (uint)sVar4;
        if (((int)uVar6 < 0) || (uVar6 != (uint)sVar5)) break;
        if (uVar6 == 0) {
          close(__fd);
          close(iVar2);
          return 0;
        }
        iVar3 = bcmp(bytes1,bytes2,(ulong)(uVar6 & 0x7fffffff));
      } while (iVar3 == 0);
      close(__fd);
      close(iVar2);
      return 1;
    }
  }
  close(__fd);
  return -1;
}

Assistant:

static int compareFiles(const char *r1 /* temp */, const char *r2 /* result */) {
    int res1, res2;
    int fd1, fd2;
    char bytes1[4096];
    char bytes2[4096];

    if (update_results) {
        fd1 = open(r1, RD_FLAGS);
        if (fd1 < 0)
            return(-1);
        fd2 = open(r2, WR_FLAGS, 0644);
        if (fd2 < 0) {
            close(fd1);
            return(-1);
        }
        do {
            res1 = read(fd1, bytes1, 4096);
            if (res1 <= 0)
                break;
            res2 = write(fd2, bytes1, res1);
            if (res2 <= 0 || res2 != res1)
                break;
        } while (1);
        close(fd2);
        close(fd1);
        return(res1 != 0);
    }

    fd1 = open(r1, RD_FLAGS);
    if (fd1 < 0)
        return(-1);
    fd2 = open(r2, RD_FLAGS);
    if (fd2 < 0) {
        close(fd1);
        return(-1);
    }
    while (1) {
        res1 = read(fd1, bytes1, 4096);
        res2 = read(fd2, bytes2, 4096);
	if ((res1 != res2) || (res1 < 0)) {
	    close(fd1);
	    close(fd2);
	    return(1);
	}
	if (res1 == 0)
	    break;
	if (memcmp(bytes1, bytes2, res1) != 0) {
	    close(fd1);
	    close(fd2);
	    return(1);
	}
    }
    close(fd1);
    close(fd2);
    return(0);
}